

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary-ops.cpp
# Opt level: O3

void ggml_compute_forward_sgn(ggml_compute_params *params,ggml_tensor *dst)

{
  uint *puVar1;
  ggml_type gVar2;
  ggml_type gVar3;
  int iVar4;
  ggml_tensor *pgVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  long lVar9;
  long lVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  void *pvVar14;
  void *pvVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  ulong uVar44;
  ulong uVar45;
  undefined8 uVar46;
  bool bVar47;
  byte bVar48;
  byte bVar49;
  char cVar50;
  long lVar51;
  long lVar52;
  long lVar53;
  long lVar54;
  ulong uVar55;
  char *pcVar56;
  long lVar57;
  int64_t nth;
  ushort uVar58;
  undefined8 uVar59;
  int64_t ir;
  long lVar60;
  long lVar61;
  ggml_tensor *src0;
  int iVar62;
  undefined1 auVar64 [32];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  anon_union_4_2_947300a4 u;
  undefined1 auVar63 [32];
  
  pgVar5 = dst->src[0];
  gVar2 = dst->type;
  gVar3 = pgVar5->type;
  if (gVar3 == GGML_TYPE_BF16) {
    if (gVar2 == GGML_TYPE_F32) {
      cVar50 = ggml_is_contiguous_1(pgVar5);
      if (((cVar50 != '\0') && (cVar50 = ggml_is_contiguous_1(dst), cVar50 != '\0')) &&
         (cVar50 = ggml_are_same_shape(pgVar5,dst), cVar50 != '\0')) {
        if (dst->nb[0] == 4) {
          if (pgVar5->nb[0] == 2) {
            sVar6 = pgVar5->nb[2];
            sVar7 = pgVar5->nb[3];
            sVar8 = pgVar5->nb[1];
            lVar9 = pgVar5->ne[1];
            lVar61 = pgVar5->ne[2];
            lVar10 = dst->ne[0];
            sVar11 = dst->nb[1];
            sVar12 = dst->nb[2];
            sVar13 = dst->nb[3];
            iVar62 = params->ith;
            iVar4 = params->nth;
            lVar51 = ggml_nrows(pgVar5);
            lVar52 = ((long)iVar4 + -1 + lVar51) / (long)iVar4;
            lVar60 = iVar62 * lVar52;
            lVar52 = lVar52 + lVar60;
            if (lVar51 <= lVar52) {
              lVar52 = lVar51;
            }
            if (lVar60 < lVar52) {
              auVar65 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
              auVar66 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
              pvVar14 = pgVar5->data;
              lVar61 = lVar61 * lVar9;
              pvVar15 = dst->data;
              auVar67 = vpbroadcastq_avx512f();
              do {
                lVar51 = lVar60 / lVar61;
                lVar57 = lVar60 % lVar61;
                lVar53 = lVar57 / lVar9;
                lVar57 = lVar57 % lVar9;
                if (0 < lVar10) {
                  uVar55 = 0;
                  do {
                    auVar68 = vpbroadcastq_avx512f();
                    auVar69 = vporq_avx512f(auVar68,auVar65);
                    auVar68 = vporq_avx512f(auVar68,auVar66);
                    uVar59 = vpcmpuq_avx512f(auVar68,auVar67,2);
                    bVar48 = (byte)uVar59;
                    uVar59 = vpcmpuq_avx512f(auVar69,auVar67,2);
                    bVar49 = (byte)uVar59;
                    uVar58 = CONCAT11(bVar49,bVar48);
                    auVar63 = vmovdqu16_avx512vl(*(undefined1 (*) [32])
                                                  ((long)pvVar14 +
                                                  uVar55 * 2 +
                                                  lVar53 * sVar6 + lVar57 * sVar8 + lVar51 * sVar7))
                    ;
                    auVar64._2_2_ = (ushort)((byte)(uVar58 >> 1) & 1) * auVar63._2_2_;
                    auVar64._0_2_ = (ushort)(bVar48 & 1) * auVar63._0_2_;
                    auVar64._4_2_ = (ushort)((byte)(uVar58 >> 2) & 1) * auVar63._4_2_;
                    auVar64._6_2_ = (ushort)((byte)(uVar58 >> 3) & 1) * auVar63._6_2_;
                    auVar64._8_2_ = (ushort)((byte)(uVar58 >> 4) & 1) * auVar63._8_2_;
                    auVar64._10_2_ = (ushort)((byte)(uVar58 >> 5) & 1) * auVar63._10_2_;
                    auVar64._12_2_ = (ushort)((byte)(uVar58 >> 6) & 1) * auVar63._12_2_;
                    auVar64._14_2_ = (ushort)((byte)(uVar58 >> 7) & 1) * auVar63._14_2_;
                    auVar64._16_2_ = (ushort)(bVar49 & 1) * auVar63._16_2_;
                    auVar64._18_2_ = (ushort)(bVar49 >> 1 & 1) * auVar63._18_2_;
                    auVar64._20_2_ = (ushort)(bVar49 >> 2 & 1) * auVar63._20_2_;
                    auVar64._22_2_ = (ushort)(bVar49 >> 3 & 1) * auVar63._22_2_;
                    auVar64._24_2_ = (ushort)(bVar49 >> 4 & 1) * auVar63._24_2_;
                    auVar64._26_2_ = (ushort)(bVar49 >> 5 & 1) * auVar63._26_2_;
                    auVar64._28_2_ = (ushort)(bVar49 >> 6 & 1) * auVar63._28_2_;
                    auVar64._30_2_ = (ushort)(bVar49 >> 7) * auVar63._30_2_;
                    auVar68 = vpmovzxwd_avx512f(auVar64);
                    auVar68 = vpslld_avx512f(auVar68,0x10);
                    uVar44 = vcmpps_avx512f(auVar68,ZEXT1664(ZEXT816(0) << 0x40),1);
                    uVar45 = vcmpps_avx512f(ZEXT1664(ZEXT816(0) << 0x40),auVar68,1);
                    auVar68 = vbroadcastss_avx512f(ZEXT416(0xbf800000));
                    auVar69 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                    bVar47 = (bool)((byte)uVar45 & 1);
                    bVar16 = (bool)((byte)(uVar45 >> 1) & 1);
                    bVar18 = (bool)((byte)(uVar45 >> 2) & 1);
                    bVar20 = (bool)((byte)(uVar45 >> 3) & 1);
                    bVar22 = (bool)((byte)(uVar45 >> 4) & 1);
                    bVar24 = (bool)((byte)(uVar45 >> 5) & 1);
                    bVar26 = (bool)((byte)(uVar45 >> 6) & 1);
                    bVar28 = (bool)((byte)(uVar45 >> 7) & 1);
                    bVar30 = (bool)((byte)(uVar45 >> 8) & 1);
                    bVar31 = (bool)((byte)(uVar45 >> 9) & 1);
                    bVar33 = (bool)((byte)(uVar45 >> 10) & 1);
                    bVar35 = (bool)((byte)(uVar45 >> 0xb) & 1);
                    bVar37 = (bool)((byte)(uVar45 >> 0xc) & 1);
                    bVar39 = (bool)((byte)(uVar45 >> 0xd) & 1);
                    bVar41 = (bool)((byte)(uVar45 >> 0xe) & 1);
                    bVar43 = SUB81(uVar45 >> 0xf,0);
                    puVar1 = (uint *)((long)pvVar15 +
                                     uVar55 * 4 +
                                     lVar53 * sVar12 + lVar57 * sVar11 + lVar51 * sVar13);
                    bVar17 = (bool)((byte)(uVar58 >> 1) & 1);
                    bVar19 = (bool)((byte)(uVar58 >> 2) & 1);
                    bVar21 = (bool)((byte)(uVar58 >> 3) & 1);
                    bVar23 = (bool)((byte)(uVar58 >> 4) & 1);
                    bVar25 = (bool)((byte)(uVar58 >> 5) & 1);
                    bVar27 = (bool)((byte)(uVar58 >> 6) & 1);
                    bVar29 = (bool)((byte)(uVar58 >> 7) & 1);
                    bVar32 = (bool)(bVar49 >> 1 & 1);
                    bVar34 = (bool)(bVar49 >> 2 & 1);
                    bVar36 = (bool)(bVar49 >> 3 & 1);
                    bVar38 = (bool)(bVar49 >> 4 & 1);
                    bVar40 = (bool)(bVar49 >> 5 & 1);
                    bVar42 = (bool)(bVar49 >> 6 & 1);
                    *puVar1 = (uint)(bVar48 & 1) *
                              ((uint)bVar47 * auVar69._0_4_ |
                              (uint)!bVar47 * (uint)((byte)uVar44 & 1) * auVar68._0_4_) |
                              (uint)!(bool)(bVar48 & 1) * *puVar1;
                    puVar1[1] = (uint)bVar17 *
                                ((uint)bVar16 * auVar69._4_4_ |
                                (uint)!bVar16 * (uint)((byte)(uVar44 >> 1) & 1) * auVar68._4_4_) |
                                (uint)!bVar17 * puVar1[1];
                    puVar1[2] = (uint)bVar19 *
                                ((uint)bVar18 * auVar69._8_4_ |
                                (uint)!bVar18 * (uint)((byte)(uVar44 >> 2) & 1) * auVar68._8_4_) |
                                (uint)!bVar19 * puVar1[2];
                    puVar1[3] = (uint)bVar21 *
                                ((uint)bVar20 * auVar69._12_4_ |
                                (uint)!bVar20 * (uint)((byte)(uVar44 >> 3) & 1) * auVar68._12_4_) |
                                (uint)!bVar21 * puVar1[3];
                    puVar1[4] = (uint)bVar23 *
                                ((uint)bVar22 * auVar69._16_4_ |
                                (uint)!bVar22 * (uint)((byte)(uVar44 >> 4) & 1) * auVar68._16_4_) |
                                (uint)!bVar23 * puVar1[4];
                    puVar1[5] = (uint)bVar25 *
                                ((uint)bVar24 * auVar69._20_4_ |
                                (uint)!bVar24 * (uint)((byte)(uVar44 >> 5) & 1) * auVar68._20_4_) |
                                (uint)!bVar25 * puVar1[5];
                    puVar1[6] = (uint)bVar27 *
                                ((uint)bVar26 * auVar69._24_4_ |
                                (uint)!bVar26 * (uint)((byte)(uVar44 >> 6) & 1) * auVar68._24_4_) |
                                (uint)!bVar27 * puVar1[6];
                    puVar1[7] = (uint)bVar29 *
                                ((uint)bVar28 * auVar69._28_4_ |
                                (uint)!bVar28 * (uint)((byte)(uVar44 >> 7) & 1) * auVar68._28_4_) |
                                (uint)!bVar29 * puVar1[7];
                    puVar1[8] = (uint)(bVar49 & 1) *
                                ((uint)bVar30 * auVar69._32_4_ |
                                (uint)!bVar30 * (uint)((byte)(uVar44 >> 8) & 1) * auVar68._32_4_) |
                                (uint)!(bool)(bVar49 & 1) * puVar1[8];
                    puVar1[9] = (uint)bVar32 *
                                ((uint)bVar31 * auVar69._36_4_ |
                                (uint)!bVar31 * (uint)((byte)(uVar44 >> 9) & 1) * auVar68._36_4_) |
                                (uint)!bVar32 * puVar1[9];
                    puVar1[10] = (uint)bVar34 *
                                 ((uint)bVar33 * auVar69._40_4_ |
                                 (uint)!bVar33 * (uint)((byte)(uVar44 >> 10) & 1) * auVar68._40_4_)
                                 | (uint)!bVar34 * puVar1[10];
                    puVar1[0xb] = (uint)bVar36 *
                                  ((uint)bVar35 * auVar69._44_4_ |
                                  (uint)!bVar35 * (uint)((byte)(uVar44 >> 0xb) & 1) * auVar68._44_4_
                                  ) | (uint)!bVar36 * puVar1[0xb];
                    puVar1[0xc] = (uint)bVar38 *
                                  ((uint)bVar37 * auVar69._48_4_ |
                                  (uint)!bVar37 * (uint)((byte)(uVar44 >> 0xc) & 1) * auVar68._48_4_
                                  ) | (uint)!bVar38 * puVar1[0xc];
                    puVar1[0xd] = (uint)bVar40 *
                                  ((uint)bVar39 * auVar69._52_4_ |
                                  (uint)!bVar39 * (uint)((byte)(uVar44 >> 0xd) & 1) * auVar68._52_4_
                                  ) | (uint)!bVar40 * puVar1[0xd];
                    puVar1[0xe] = (uint)bVar42 *
                                  ((uint)bVar41 * auVar69._56_4_ |
                                  (uint)!bVar41 * (uint)((byte)(uVar44 >> 0xe) & 1) * auVar68._56_4_
                                  ) | (uint)!bVar42 * puVar1[0xe];
                    puVar1[0xf] = (uint)(bVar49 >> 7) *
                                  ((uint)bVar43 * auVar69._60_4_ |
                                  (uint)!bVar43 * (uint)(byte)(uVar44 >> 0xf) * auVar68._60_4_) |
                                  (uint)!(bool)(bVar49 >> 7) * puVar1[0xf];
                    uVar55 = uVar55 + 0x10;
                  } while ((lVar10 + 0xfU & 0xfffffffffffffff0) != uVar55);
                }
                lVar60 = lVar60 + 1;
              } while (lVar60 != lVar52);
            }
            return;
          }
          goto LAB_001294c9;
        }
        goto LAB_001294ad;
      }
    }
    else {
      if (gVar2 != GGML_TYPE_BF16) goto LAB_001294a5;
      cVar50 = ggml_is_contiguous_1(pgVar5);
      if (((cVar50 != '\0') && (cVar50 = ggml_is_contiguous_1(dst), cVar50 != '\0')) &&
         (cVar50 = ggml_are_same_shape(pgVar5,dst), cVar50 != '\0')) {
        if (dst->nb[0] != 2) goto LAB_001294ad;
        if (pgVar5->nb[0] == 2) {
          sVar6 = pgVar5->nb[2];
          sVar7 = pgVar5->nb[3];
          sVar8 = pgVar5->nb[1];
          lVar9 = pgVar5->ne[1];
          lVar61 = pgVar5->ne[2];
          lVar10 = dst->ne[0];
          sVar11 = dst->nb[1];
          sVar12 = dst->nb[2];
          sVar13 = dst->nb[3];
          iVar62 = params->ith;
          iVar4 = params->nth;
          lVar51 = ggml_nrows(pgVar5);
          lVar52 = ((long)iVar4 + -1 + lVar51) / (long)iVar4;
          lVar60 = iVar62 * lVar52;
          lVar52 = lVar52 + lVar60;
          if (lVar51 <= lVar52) {
            lVar52 = lVar51;
          }
          if (lVar52 <= lVar60) {
            return;
          }
          pvVar14 = pgVar5->data;
          lVar61 = lVar61 * lVar9;
          auVar70 = ZEXT816(0) << 0x40;
          pvVar15 = dst->data;
          do {
            lVar51 = lVar60 / lVar61;
            lVar57 = lVar60 % lVar61;
            lVar53 = lVar57 / lVar9;
            lVar57 = lVar57 % lVar9;
            if (0 < lVar10) {
              lVar54 = 0;
              do {
                uVar58 = *(ushort *)
                          ((long)pvVar14 +
                          lVar54 * 2 + lVar53 * sVar6 + lVar57 * sVar8 + lVar51 * sVar7);
                auVar71 = ZEXT216(uVar58) << 0x10;
                uVar59 = vcmpss_avx512f(auVar71,auVar70,1);
                uVar46 = vcmpss_avx512f(auVar70,auVar71,1);
                bVar47 = (bool)((byte)uVar46 & 1);
                iVar62 = (uint)bVar47 * 0x3f800000 +
                         (uint)!bVar47 * (uint)((byte)uVar59 & 1) * -0x40800000;
                uVar59 = vcmpss_avx512f(ZEXT216(uVar58) << 0x10,auVar70,0xc);
                if ((uint)((byte)uVar59 & 1) * 0x3f800000 < 0x7f800001) {
                  uVar58 = (ushort)((uint)(iVar62 + 0x7fff) >> 0x10);
                }
                else {
                  uVar58 = (ushort)((uint)iVar62 >> 0x10) | 0x40;
                }
                *(ushort *)
                 ((long)pvVar15 + lVar54 * 2 + lVar53 * sVar12 + lVar57 * sVar11 + lVar51 * sVar13)
                     = uVar58;
                lVar54 = lVar54 + 1;
              } while (lVar10 != lVar54);
            }
            lVar60 = lVar60 + 1;
          } while (lVar60 != lVar52);
          return;
        }
        goto LAB_001294c9;
      }
    }
  }
  else if (gVar3 == GGML_TYPE_F16) {
    if (gVar2 == GGML_TYPE_F32) {
      cVar50 = ggml_is_contiguous_1(pgVar5);
      if (((cVar50 != '\0') && (cVar50 = ggml_is_contiguous_1(dst), cVar50 != '\0')) &&
         (cVar50 = ggml_are_same_shape(pgVar5,dst), cVar50 != '\0')) {
        if (dst->nb[0] != 4) goto LAB_001294ad;
        if (pgVar5->nb[0] == 2) {
          sVar6 = pgVar5->nb[2];
          sVar7 = pgVar5->nb[3];
          sVar8 = pgVar5->nb[1];
          lVar9 = pgVar5->ne[1];
          lVar61 = pgVar5->ne[2];
          lVar10 = dst->ne[0];
          sVar11 = dst->nb[3];
          sVar12 = dst->nb[1];
          sVar13 = dst->nb[2];
          iVar62 = params->ith;
          iVar4 = params->nth;
          lVar51 = ggml_nrows(pgVar5);
          lVar52 = ((long)iVar4 + -1 + lVar51) / (long)iVar4;
          lVar60 = iVar62 * lVar52;
          lVar52 = lVar52 + lVar60;
          if (lVar51 <= lVar52) {
            lVar52 = lVar51;
          }
          if (lVar52 <= lVar60) {
            return;
          }
          lVar61 = lVar61 * lVar9;
          pvVar14 = dst->data;
          pvVar15 = pgVar5->data;
          do {
            lVar51 = lVar60 / lVar61;
            lVar57 = lVar60 % lVar61;
            lVar53 = lVar57 / lVar9;
            lVar57 = lVar57 % lVar9;
            if (0 < lVar10) {
              lVar54 = 0;
              do {
                uVar59 = vcmpss_avx512f(ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                         (ulong)*(ushort *)
                                                                 ((long)pvVar15 +
                                                                 lVar54 * 2 +
                                                                 lVar53 * sVar6 +
                                                                 lVar57 * sVar8 + lVar51 * sVar7) *
                                                         4)),ZEXT816(0) << 0x40,1);
                uVar46 = vcmpss_avx512f(ZEXT816(0) << 0x40,
                                        ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                         (ulong)*(ushort *)
                                                                 ((long)pvVar15 +
                                                                 lVar54 * 2 +
                                                                 lVar53 * sVar6 +
                                                                 lVar57 * sVar8 + lVar51 * sVar7) *
                                                         4)),1);
                bVar47 = (bool)((byte)uVar46 & 1);
                *(uint *)((long)pvVar14 +
                         lVar54 * 4 + lVar53 * sVar13 + lVar57 * sVar12 + lVar51 * sVar11) =
                     (uint)bVar47 * 0x3f800000 +
                     (uint)!bVar47 * (uint)((byte)uVar59 & 1) * -0x40800000;
                lVar54 = lVar54 + 1;
              } while (lVar10 != lVar54);
            }
            lVar60 = lVar60 + 1;
          } while (lVar60 != lVar52);
          return;
        }
LAB_001294c9:
        pcVar56 = "nb00 == sizeof(src0_t)";
        uVar59 = 0x56;
        goto LAB_001294e3;
      }
    }
    else {
      if (gVar2 != GGML_TYPE_F16) goto LAB_001294a5;
      cVar50 = ggml_is_contiguous_1(pgVar5);
      if (((cVar50 != '\0') && (cVar50 = ggml_is_contiguous_1(dst), cVar50 != '\0')) &&
         (cVar50 = ggml_are_same_shape(pgVar5,dst), cVar50 != '\0')) {
        if (dst->nb[0] != 2) goto LAB_001294ad;
        if (pgVar5->nb[0] == 2) {
          sVar6 = pgVar5->nb[2];
          sVar7 = pgVar5->nb[3];
          sVar8 = pgVar5->nb[1];
          lVar9 = pgVar5->ne[1];
          lVar61 = pgVar5->ne[2];
          lVar10 = dst->ne[0];
          iVar62 = params->ith;
          iVar4 = params->nth;
          lVar51 = ggml_nrows(pgVar5);
          lVar52 = ((long)iVar4 + -1 + lVar51) / (long)iVar4;
          lVar60 = iVar62 * lVar52;
          lVar52 = lVar52 + lVar60;
          if (lVar51 <= lVar52) {
            lVar52 = lVar51;
          }
          if (lVar52 <= lVar60) {
            return;
          }
          lVar61 = lVar61 * lVar9;
          do {
            lVar51 = lVar60 % lVar61;
            if (0 < lVar10) {
              lVar53 = 0;
              do {
                uVar59 = vcmpss_avx512f(ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                         (ulong)*(ushort *)
                                                                 ((long)pgVar5->data +
                                                                 lVar53 * 2 +
                                                                 (lVar51 / lVar9) * sVar6 +
                                                                 (lVar51 % lVar9) * sVar8 +
                                                                 (lVar60 / lVar61) * sVar7) * 4)),
                                        ZEXT816(0) << 0x40,1);
                uVar46 = vcmpss_avx512f(ZEXT816(0) << 0x40,
                                        ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                         (ulong)*(ushort *)
                                                                 ((long)pgVar5->data +
                                                                 lVar53 * 2 +
                                                                 (lVar51 / lVar9) * sVar6 +
                                                                 (lVar51 % lVar9) * sVar8 +
                                                                 (lVar60 / lVar61) * sVar7) * 4)),1)
                ;
                bVar47 = (bool)((byte)uVar46 & 1);
                auVar70 = vcvtps2ph_f16c(ZEXT416((uint)bVar47 * 0x3f800000 +
                                                 (uint)!bVar47 *
                                                 (uint)((byte)uVar59 & 1) * -0x40800000),0);
                vpextrw_avx(auVar70,0);
                lVar53 = lVar53 + 1;
              } while (lVar10 != lVar53);
            }
            lVar60 = lVar60 + 1;
          } while (lVar60 != lVar52);
          return;
        }
        goto LAB_001294c9;
      }
    }
  }
  else {
    if ((gVar3 != GGML_TYPE_F32) || (gVar2 != GGML_TYPE_F32)) {
LAB_001294a5:
      ggml_compute_forward_sgn_cold_1();
LAB_001294ad:
      pcVar56 = "nb0 == sizeof(dst_t)";
      uVar59 = 0x55;
      goto LAB_001294e3;
    }
    cVar50 = ggml_is_contiguous_1(pgVar5);
    if (((cVar50 != '\0') && (cVar50 = ggml_is_contiguous_1(dst), cVar50 != '\0')) &&
       (cVar50 = ggml_are_same_shape(pgVar5,dst), cVar50 != '\0')) {
      if (dst->nb[0] != 4) goto LAB_001294ad;
      if (pgVar5->nb[0] == 4) {
        sVar6 = pgVar5->nb[2];
        sVar7 = pgVar5->nb[3];
        sVar8 = pgVar5->nb[1];
        lVar9 = pgVar5->ne[1];
        lVar61 = pgVar5->ne[2];
        lVar10 = dst->ne[0];
        sVar11 = dst->nb[3];
        sVar12 = dst->nb[1];
        sVar13 = dst->nb[2];
        iVar62 = params->ith;
        iVar4 = params->nth;
        lVar51 = ggml_nrows(pgVar5);
        lVar52 = ((long)iVar4 + -1 + lVar51) / (long)iVar4;
        lVar60 = iVar62 * lVar52;
        lVar52 = lVar52 + lVar60;
        if (lVar51 <= lVar52) {
          lVar52 = lVar51;
        }
        if (lVar52 <= lVar60) {
          return;
        }
        lVar61 = lVar61 * lVar9;
        pvVar14 = dst->data;
        pvVar15 = pgVar5->data;
        do {
          lVar51 = lVar60 / lVar61;
          lVar57 = lVar60 % lVar61;
          lVar53 = lVar57 / lVar9;
          lVar57 = lVar57 % lVar9;
          if (0 < lVar10) {
            lVar54 = 0;
            do {
              auVar70 = ZEXT416(*(uint *)((long)pvVar15 +
                                         lVar54 * 4 +
                                         lVar53 * sVar6 + lVar57 * sVar8 + lVar51 * sVar7));
              uVar59 = vcmpss_avx512f(auVar70,ZEXT816(0) << 0x40,1);
              uVar46 = vcmpss_avx512f(ZEXT816(0) << 0x40,auVar70,1);
              bVar47 = (bool)((byte)uVar46 & 1);
              *(uint *)((long)pvVar14 +
                       lVar54 * 4 + lVar53 * sVar13 + lVar57 * sVar12 + lVar51 * sVar11) =
                   (uint)bVar47 * 0x3f800000 +
                   (uint)!bVar47 * (uint)((byte)uVar59 & 1) * -0x40800000;
              lVar54 = lVar54 + 1;
            } while (lVar10 != lVar54);
          }
          lVar60 = lVar60 + 1;
        } while (lVar60 != lVar52);
        return;
      }
      goto LAB_001294c9;
    }
  }
  pcVar56 = 
  "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)";
  uVar59 = 0x51;
LAB_001294e3:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/unary-ops.cpp"
             ,uVar59,"GGML_ASSERT(%s) failed",pcVar56);
}

Assistant:

void ggml_compute_forward_sgn(const ggml_compute_params * params, ggml_tensor * dst) {
    unary_op<op_sgn>(params, dst);
}